

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
          (ReferenceQuadRenderer *this,PixelBufferAccess *colorBuffer,PixelBufferAccess *depthBuffer
          ,PixelBufferAccess *stencilBuffer,IntegerQuad *quad,FragmentOperationState *state)

{
  GenericVec4 *pGVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  float yFactor;
  FaceType fragmentFacing;
  Vec4 color1;
  Vec4 color;
  MultisamplePixelBufferAccess local_a8;
  MultisamplePixelBufferAccess local_80;
  MultisamplePixelBufferAccess local_58;
  
  iVar3 = (quad->posA).m_data[0];
  iVar4 = (quad->posB).m_data[0];
  iVar5 = (quad->posA).m_data[1];
  iVar6 = (quad->posB).m_data[1];
  iVar7 = iVar6;
  if (iVar5 < iVar6) {
    iVar7 = iVar5;
  }
  iVar12 = iVar6;
  if (iVar6 < iVar5) {
    iVar12 = iVar5;
  }
  iVar8 = iVar4;
  if (iVar3 < iVar4) {
    iVar8 = iVar3;
  }
  iVar13 = iVar4;
  if (iVar4 < iVar3) {
    iVar13 = iVar3;
  }
  lVar10 = (long)iVar3 - (long)iVar4;
  lVar15 = -lVar10;
  if (0 < lVar10) {
    lVar15 = lVar10;
  }
  lVar11 = (long)iVar5 - (long)iVar6;
  lVar10 = -lVar11;
  if (0 < lVar11) {
    lVar10 = lVar11;
  }
  iVar16 = iVar7;
  do {
    yFactor = ((float)(iVar16 - iVar7) + 0.5) / (float)((int)lVar10 + 1);
    if (iVar6 < iVar5) {
      yFactor = 1.0 - yFactor;
    }
    iVar14 = 0;
    do {
      fVar17 = ((float)iVar14 + 0.5) / (float)((int)lVar15 + 1);
      if (iVar4 < iVar3) {
        fVar17 = 1.0 - fVar17;
      }
      triQuadInterpolate<tcu::Vector<float,4>>((FragmentOpUtil *)&color,quad->color,fVar17,yFactor);
      triQuadInterpolate<tcu::Vector<float,4>>
                ((FragmentOpUtil *)&color1,quad->color1,fVar17,yFactor);
      if (1.0 <= yFactor + fVar17) {
        fVar2 = quad->depth[3];
        fVar17 = (quad->depth[2] - fVar2) * (1.0 - yFactor) +
                 (1.0 - fVar17) * (quad->depth[1] - fVar2) + fVar2;
      }
      else {
        fVar2 = quad->depth[0];
        fVar17 = (quad->depth[1] - fVar2) * yFactor + (quad->depth[2] - fVar2) * fVar17 + fVar2;
      }
      iVar9 = this->m_fragmentBufferSize;
      fragmentFacing = (FaceType)(iVar4 < iVar3 != iVar6 < iVar5);
      if (0x3ff < iVar9) {
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer);
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer);
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer);
        rr::FragmentProcessor::render
                  (&this->m_fragmentProcessor,&local_58,&local_80,&local_a8,this->m_fragmentBuffer,
                   this->m_fragmentBufferSize,fragmentFacing,state);
        this->m_fragmentBufferSize = 0;
        iVar9 = 0;
      }
      this->m_fragmentDepths[iVar9] = fVar17;
      *(ulong *)this->m_fragmentBuffer[iVar9].pixelCoord.m_data = CONCAT44(iVar16,iVar8 + iVar14);
      pGVar1 = &this->m_fragmentBuffer[iVar9].value;
      *(undefined8 *)&pGVar1->v = color.m_data._0_8_;
      *(undefined8 *)((long)&pGVar1->v + 8) = color.m_data._8_8_;
      pGVar1 = &this->m_fragmentBuffer[iVar9].value1;
      *(undefined8 *)&pGVar1->v = color1.m_data._0_8_;
      *(undefined8 *)((long)&pGVar1->v + 8) = color1.m_data._8_8_;
      this->m_fragmentBuffer[iVar9].coverage = 1;
      this->m_fragmentBuffer[iVar9].sampleDepths = this->m_fragmentDepths + iVar9;
      this->m_fragmentBufferSize = this->m_fragmentBufferSize + 1;
      iVar9 = iVar8 + iVar14;
      iVar14 = iVar14 + 1;
    } while (iVar9 + 1 <= iVar13);
    iVar16 = iVar16 + 1;
  } while (iVar16 <= iVar12);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer);
  rr::FragmentProcessor::render
            (&this->m_fragmentProcessor,&local_58,&local_80,&local_a8,this->m_fragmentBuffer,
             this->m_fragmentBufferSize,fragmentFacing,state);
  this->m_fragmentBufferSize = 0;
  return;
}

Assistant:

void ReferenceQuadRenderer::render (const tcu::PixelBufferAccess&			colorBuffer,
									const tcu::PixelBufferAccess&			depthBuffer,
									const tcu::PixelBufferAccess&			stencilBuffer,
									const IntegerQuad&						quad,
									const rr::FragmentOperationState&		state)
{
	bool			flipX			= quad.posA.x() > quad.posB.x();
	bool			flipY			= quad.posA.y() > quad.posB.y();
	rr::FaceType	faceType		= flipX == flipY ? rr::FACETYPE_FRONT : rr::FACETYPE_BACK;
	int				xFirst			= flipX ? quad.posB.x() : quad.posA.x();
	int				xLast			= flipX ? quad.posA.x() : quad.posB.x();
	int				yFirst			= flipY ? quad.posB.y() : quad.posA.y();
	int				yLast			= flipY ? quad.posA.y() : quad.posB.y();
	float			width			= (float)(xLast - xFirst + 1);
	float			height			= (float)(yLast - yFirst + 1);

	for (int y = yFirst; y <= yLast; y++)
	{
		// Interpolation factor for y.
		float yRatio = (0.5f + (float)(y - yFirst)) / height;
		if (flipY)
			yRatio = 1.0f - yRatio;

		for (int x = xFirst; x <= xLast; x++)
		{
			// Interpolation factor for x.
			float xRatio = (0.5f + (float)(x - xFirst)) / width;
			if (flipX)
				xRatio = 1.0f - xRatio;

			tcu::Vec4	color	= triQuadInterpolate(quad.color, xRatio, yRatio);
			tcu::Vec4	color1	= triQuadInterpolate(quad.color1, xRatio, yRatio);
			float		depth	= triQuadInterpolate(quad.depth, xRatio, yRatio);

			// Interpolated color and depth.

			DE_STATIC_ASSERT(MAX_FRAGMENT_BUFFER_SIZE == DE_LENGTH_OF_ARRAY(m_fragmentBuffer));

			if (m_fragmentBufferSize >= MAX_FRAGMENT_BUFFER_SIZE)
				flushFragmentBuffer(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer),
									rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer),
									rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer), faceType, state);

			m_fragmentDepths[m_fragmentBufferSize] = depth;
			m_fragmentBuffer[m_fragmentBufferSize] = rr::Fragment(tcu::IVec2(x, y), rr::GenericVec4(color), rr::GenericVec4(color1), 1u /* coverage mask */, &m_fragmentDepths[m_fragmentBufferSize]);
			m_fragmentBufferSize++;
		}
	}

	flushFragmentBuffer(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer),
						rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer),
						rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer), faceType, state);
}